

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O3

void swrenderer::R_SortVisSprites(_func_bool_vissprite_t_ptr_vissprite_t_ptr *compare,size_t first)

{
  int iVar1;
  vissprite_t **__first;
  uint uVar2;
  long lVar3;
  vissprite_t **ppvVar4;
  ulong uVar5;
  ulong uVar6;
  long __buffer_size;
  pair<swrenderer::vissprite_t_**,_long> pVar7;
  
  vsprcount = (uint)(vissprite_p - (first * 8 + vissprites) >> 3);
  if (vsprcount != 0) {
    if (spritesortersize < MaxVisSprites) {
      if (spritesorter != (vissprite_t **)0x0) {
        operator_delete__(spritesorter);
      }
      iVar1 = MaxVisSprites;
      uVar6 = 0xffffffffffffffff;
      if (-1 < MaxVisSprites) {
        uVar6 = (long)MaxVisSprites * 8;
      }
      spritesorter = (vissprite_t **)operator_new__(uVar6);
      spritesortersize = iVar1;
    }
    uVar2 = vsprcount;
    __first = spritesorter;
    lVar3 = firstvissprite;
    uVar6 = (ulong)vsprcount;
    if ((i_compatflags._3_1_ & 8) == 0) {
      if (0 < (int)vsprcount) {
        uVar5 = 0;
        do {
          __first[uVar5] = *(vissprite_t **)(lVar3 + uVar5 * 8);
          uVar5 = uVar5 + 1;
        } while (uVar6 != uVar5);
      }
    }
    else {
      ppvVar4 = spritesorter;
      if (0 < (int)vsprcount) {
        do {
          *ppvVar4 = *(vissprite_t **)(lVar3 + -8 + uVar6 * 8);
          uVar6 = uVar6 - 1;
          ppvVar4 = ppvVar4 + 1;
        } while (uVar6 != 0);
      }
    }
    if (uVar2 != 0) {
      lVar3 = (long)(int)uVar2;
      pVar7 = std::get_temporary_buffer<swrenderer::vissprite_t*>
                        ((long)(int)((lVar3 - (lVar3 + 1 >> 0x3f)) + 1U >> 1));
      __buffer_size = pVar7.second;
      ppvVar4 = pVar7.first;
      if (ppvVar4 == (vissprite_t **)0x0) {
        __buffer_size = 0;
        std::
        __inplace_stable_sort<swrenderer::vissprite_t**,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(swrenderer::vissprite_t*,swrenderer::vissprite_t*)>>
                  (__first,__first + lVar3,
                   (_Iter_comp_iter<bool_(*)(swrenderer::vissprite_t_*,_swrenderer::vissprite_t_*)>)
                   compare);
      }
      else {
        std::
        __stable_sort_adaptive<swrenderer::vissprite_t**,swrenderer::vissprite_t**,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(swrenderer::vissprite_t*,swrenderer::vissprite_t*)>>
                  (__first,__first + lVar3,ppvVar4,__buffer_size,
                   (_Iter_comp_iter<bool_(*)(swrenderer::vissprite_t_*,_swrenderer::vissprite_t_*)>)
                   compare);
      }
      operator_delete(ppvVar4,__buffer_size << 3);
      return;
    }
  }
  return;
}

Assistant:

void R_SortVisSprites (bool (*compare)(vissprite_t *, vissprite_t *), size_t first)
{
	int i;
	vissprite_t **spr;

	vsprcount = int(vissprite_p - &vissprites[first]);

	if (vsprcount == 0)
		return;

	if (spritesortersize < MaxVisSprites)
	{
		if (spritesorter != NULL)
			delete[] spritesorter;
		spritesorter = new vissprite_t *[MaxVisSprites];
		spritesortersize = MaxVisSprites;
	}

	if (!(i_compatflags & COMPATF_SPRITESORT))
	{
		for (i = 0, spr = firstvissprite; i < vsprcount; i++, spr++)
		{
			spritesorter[i] = *spr;
		}
	}
	else
	{
		// If the compatibility option is on sprites of equal distance need to
		// be sorted in inverse order. This is most easily achieved by
		// filling the sort array backwards before the sort.
		for (i = 0, spr = firstvissprite + vsprcount-1; i < vsprcount; i++, spr--)
		{
			spritesorter[i] = *spr;
		}
	}

	std::stable_sort(&spritesorter[0], &spritesorter[vsprcount], compare);
}